

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O1

bool __thiscall
cmProcessOutput::DecodeText
          (cmProcessOutput *this,vector<char,_std::allocator<char>_> *raw,
          vector<char,_std::allocator<char>_> *decoded,size_t id)

{
  string str;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  long *local_40 [2];
  long local_30 [2];
  
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  local_40[0] = local_30;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)local_40,
             (raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start,(raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  std::__cxx11::string::swap((string *)&local_60);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  std::vector<char,std::allocator<char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)decoded,local_60,local_60 + local_58);
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return true;
}

Assistant:

bool cmProcessOutput::DecodeText(std::vector<char> raw,
                                 std::vector<char>& decoded, size_t id)
{
  std::string str;
  const bool success =
    this->DecodeText(std::string(raw.begin(), raw.end()), str, id);
  decoded.assign(str.begin(), str.end());
  return success;
}